

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::PReLUParameter::InternalSerializeWithCachedSizesToArray
          (PReLUParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  FillerParameter *this_00;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint8 *puVar5;
  uint uVar6;
  byte *pbVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    this_00 = this->filler_;
    *target = '\n';
    pbVar7 = target + 1;
    uVar6 = this_00->_cached_size_;
    uVar4 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar7 = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar3);
    }
    *pbVar7 = (byte)uVar4;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar7 + 1);
  }
  if ((uVar1 & 2) != 0) {
    bVar3 = this->channel_shared_;
    *target = '\x10';
    target[1] = bVar3;
    target = target + 2;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* PReLUParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.PReLUParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.FillerParameter filler = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->filler_, deterministic, target);
  }

  // optional bool channel_shared = 2 [default = false];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->channel_shared(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.PReLUParameter)
  return target;
}